

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O1

int str_gsub(lua_State *L)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  lua_State *L_00;
  int iVar4;
  int iVar5;
  char *s;
  char *pcVar6;
  char *e;
  char *pcVar7;
  ulong uVar8;
  size_t l;
  size_t srcl;
  MatchState ms;
  luaL_Buffer b;
  ulong local_2290;
  char *local_2288;
  lua_State *local_2280;
  lua_Integer local_2278;
  size_t local_2270;
  MatchState local_2268;
  luaL_Buffer local_2048;
  
  s = luaL_checklstring(L,1,&local_2270);
  pcVar6 = luaL_checklstring(L,2,(size_t *)0x0);
  iVar4 = lua_type(L,3);
  local_2278 = luaL_optinteger(L,4,local_2270 + 1);
  cVar1 = *pcVar6;
  if (3 < iVar4 - 3U) {
    luaL_argerror(L,3,"string/function/table expected");
  }
  pcVar6 = pcVar6 + (cVar1 == '^');
  luaL_buffinit(L,&local_2048);
  local_2268.src_end = s + local_2270;
  iVar4 = 0;
  local_2288 = pcVar6;
  local_2280 = L;
  local_2268.src_init = s;
  local_2268.L = L;
  do {
    if ((int)local_2278 <= iVar4) break;
    local_2268.level = 0;
    e = match(&local_2268,s,pcVar6);
    L_00 = local_2268.L;
    if (e != (char *)0x0) {
      iVar4 = iVar4 + 1;
      iVar5 = lua_type(local_2268.L,3);
      if (iVar5 - 3U < 2) {
        pcVar7 = lua_tolstring(L_00,3,&local_2290);
        pcVar6 = local_2288;
        L = local_2280;
        if (local_2290 != 0) {
          uVar8 = 0;
          do {
            if (pcVar7[uVar8] == '%') {
              bVar2 = pcVar7[uVar8 + 1];
              uVar8 = uVar8 + 1;
              if (9 < bVar2 - 0x30) goto LAB_0011308b;
              if (bVar2 == 0x30) {
                luaL_addlstring(&local_2048,s,(long)e - (long)s);
              }
              else {
                push_onecapture(&local_2268,(char)bVar2 + -0x31,s,e);
                luaL_addvalue(&local_2048);
              }
            }
            else {
LAB_0011308b:
              if (&stack0xffffffffffffffd0 <= local_2048.p) {
                luaL_prepbuffer(&local_2048);
              }
              *local_2048.p = pcVar7[uVar8];
              local_2048.p = local_2048.p + 1;
            }
            uVar8 = uVar8 + 1;
            pcVar6 = local_2288;
            L = local_2280;
          } while (uVar8 < local_2290);
        }
      }
      else {
        if (iVar5 == 5) {
          push_onecapture(&local_2268,0,s,e);
          lua_gettable(L_00,3);
        }
        else if (iVar5 == 6) {
          lua_pushvalue(L_00,3);
          iVar5 = push_captures(&local_2268,s,e);
          lua_call(L_00,iVar5,1);
        }
        iVar5 = lua_toboolean(L_00,-1);
        if (iVar5 == 0) {
          lua_settop(L_00,-2);
          lua_pushlstring(L_00,s,(long)e - (long)s);
        }
        else {
          iVar5 = lua_isstring(L_00,-1);
          if (iVar5 == 0) {
            iVar5 = lua_type(L_00,-1);
            pcVar7 = lua_typename(L_00,iVar5);
            luaL_error(L_00,"invalid replacement value (a %s)",pcVar7);
          }
        }
        luaL_addvalue(&local_2048);
      }
    }
    bVar3 = cVar1 != '^';
    if (e == (char *)0x0 || e <= s) {
      if (s < local_2268.src_end) {
        if (&stack0xffffffffffffffd0 <= local_2048.p) {
          luaL_prepbuffer(&local_2048);
        }
        *local_2048.p = *s;
        e = s + 1;
        local_2048.p = local_2048.p + 1;
      }
      else {
        bVar3 = false;
        e = s;
      }
    }
    s = e;
  } while (bVar3);
  luaL_addlstring(&local_2048,s,(long)local_2268.src_end - (long)s);
  luaL_pushresult(&local_2048);
  lua_pushinteger(L,(long)iVar4);
  return 2;
}

Assistant:

static int str_gsub (lua_State *L) {
  size_t srcl;
  const char *src = luaL_checklstring(L, 1, &srcl);
  const char *p = luaL_checkstring(L, 2);
  int  tr = lua_type(L, 3);
  int max_s = luaL_optint(L, 4, srcl+1);
  int anchor = (*p == '^') ? (p++, 1) : 0;
  int n = 0;
  MatchState ms;
  luaL_Buffer b;
  luaL_argcheck(L, tr == LUA_TNUMBER || tr == LUA_TSTRING ||
                   tr == LUA_TFUNCTION || tr == LUA_TTABLE, 3,
                      "string/function/table expected");
  luaL_buffinit(L, &b);
  ms.L = L;
  ms.src_init = src;
  ms.src_end = src+srcl;
  while (n < max_s) {
    const char *e;
    ms.level = 0;
    e = match(&ms, src, p);
    if (e) {
      n++;
      add_value(&ms, &b, src, e);
    }
    if (e && e>src) /* non empty match? */
      src = e;  /* skip it */
    else if (src < ms.src_end)
      luaL_addchar(&b, *src++);
    else break;
    if (anchor) break;
  }
  luaL_addlstring(&b, src, ms.src_end-src);
  luaL_pushresult(&b);
  lua_pushinteger(L, n);  /* number of substitutions */
  return 2;
}